

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

InterfaceSchema __thiscall
capnp::InterfaceSchema::SuperclassList::operator[](SuperclassList *this,uint index)

{
  uint64_t id;
  InterfaceSchema IVar1;
  Schema local_60;
  uint local_54;
  undefined1 local_50 [4];
  uint location;
  Reader superclass;
  uint index_local;
  SuperclassList *this_local;
  
  superclass._reader._44_4_ = index;
  List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_50,&this->list,index);
  local_54 = _::RawBrandedSchema::makeDepLocation(SUPERCLASS,superclass._reader._44_4_);
  id = capnp::schema::Superclass::Reader::getId((Reader *)local_50);
  local_60 = Schema::getDependency((Schema *)this,id,local_54);
  IVar1 = Schema::asInterface(&local_60);
  return (InterfaceSchema)IVar1.super_Schema.raw.raw;
}

Assistant:

InterfaceSchema InterfaceSchema::SuperclassList::operator[](uint index) const {
  auto superclass = list[index];
  uint location = _::RawBrandedSchema::makeDepLocation(
      _::RawBrandedSchema::DepKind::SUPERCLASS, index);
  return parent.getDependency(superclass.getId(), location).asInterface();
}